

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::MergeReturnPass::Process(MergeReturnPass *this)

{
  IRContext *this_00;
  char cVar1;
  bool bVar2;
  Status SVar3;
  FeatureManager *pFVar4;
  bool failed;
  char local_41;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  pFVar4 = (this_00->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar4 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_00);
    pFVar4 = (this_00->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar2 = EnumSet<spv::Capability>::contains(&pFVar4->capabilities_,Shader);
  local_41 = '\0';
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = operator_new(0x18);
  *(char **)local_40._M_unused._0_8_ = &local_41;
  *(bool *)((long)local_40._M_unused._0_8_ + 8) = bVar2;
  *(MergeReturnPass **)((long)local_40._M_unused._0_8_ + 0x10) = this;
  local_28 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:36:25)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:36:25)>
             ::_M_manager;
  bVar2 = IRContext::ProcessReachableCallTree
                    ((this->super_MemPass).super_Pass.context_,(ProcessFunction *)&local_40);
  cVar1 = local_41;
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  SVar3 = Failure;
  if (cVar1 == '\0') {
    SVar3 = bVar2 ^ SuccessWithoutChange;
  }
  return SVar3;
}

Assistant:

Pass::Status MergeReturnPass::Process() {
  bool is_shader =
      context()->get_feature_mgr()->HasCapability(spv::Capability::Shader);

  bool failed = false;
  ProcessFunction pfn = [&failed, is_shader, this](Function* function) {
    std::vector<BasicBlock*> return_blocks = CollectReturnBlocks(function);
    if (return_blocks.size() <= 1) {
      if (!is_shader || return_blocks.size() == 0) {
        return false;
      }
      bool isInConstruct =
          context()->GetStructuredCFGAnalysis()->ContainingConstruct(
              return_blocks[0]->id()) != 0;
      bool endsWithReturn = return_blocks[0] == function->tail();
      if (!isInConstruct && endsWithReturn) {
        return false;
      }
    }

    function_ = function;
    return_flag_ = nullptr;
    return_value_ = nullptr;
    final_return_block_ = nullptr;

    if (is_shader) {
      if (!ProcessStructured(function, return_blocks)) {
        failed = true;
      }
    } else {
      MergeReturnBlocks(function, return_blocks);
    }
    return true;
  };

  bool modified = context()->ProcessReachableCallTree(pfn);

  if (failed) {
    return Status::Failure;
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}